

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O0

Client * __thiscall
capnp::RevocableServer<capnproto_test::capnp::test::TestInterface>::getClient
          (Client *__return_storage_ptr__,
          RevocableServer<capnproto_test::capnp::test::TestInterface> *this)

{
  ClientHook *pCVar1;
  Own<capnp::ClientHook,_std::nullptr_t> local_28;
  RevocableServer<capnproto_test::capnp::test::TestInterface> *local_18;
  RevocableServer<capnproto_test::capnp::test::TestInterface> *this_local;
  
  local_18 = this;
  this_local = (RevocableServer<capnproto_test::capnp::test::TestInterface> *)__return_storage_ptr__
  ;
  pCVar1 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->(&this->hook);
  (*pCVar1->_vptr_ClientHook[4])(&local_28);
  capnproto_test::capnp::test::TestInterface::Client::Client(__return_storage_ptr__,&local_28);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own(&local_28);
  return __return_storage_ptr__;
}

Assistant:

typename T::Client RevocableServer<T>::getClient() {
  return typename T::Client(hook->addRef());
}